

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryIOWrapper.h
# Opt level: O0

void __thiscall Assimp::MemoryIOSystem::Close(MemoryIOSystem *this,IOStream *pFile)

{
  bool bVar1;
  const_iterator local_40;
  __normal_iterator<Assimp::IOStream_**,_std::vector<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>_>
  local_38;
  IOStream **local_30;
  __normal_iterator<Assimp::IOStream_**,_std::vector<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>_>
  local_28;
  __normal_iterator<Assimp::IOStream_**,_std::vector<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>_>
  local_20;
  __normal_iterator<Assimp::IOStream_**,_std::vector<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>_>
  it;
  IOStream *pFile_local;
  MemoryIOSystem *this_local;
  
  it._M_current = (IOStream **)pFile;
  local_28._M_current =
       (IOStream **)
       std::vector<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>::begin
                 (&this->created_streams);
  local_30 = (IOStream **)
             std::vector<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>::end
                       (&this->created_streams);
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<Assimp::IOStream**,std::vector<Assimp::IOStream*,std::allocator<Assimp::IOStream*>>>,Assimp::IOStream*>
                       (local_28,(__normal_iterator<Assimp::IOStream_**,_std::vector<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>_>
                                  )local_30,(IOStream **)&it);
  local_38._M_current =
       (IOStream **)
       std::vector<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>::end
                 (&this->created_streams);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_38);
  if (bVar1) {
    if (it._M_current != (IOStream **)0x0) {
      (*(code *)(*it._M_current)[1]._vptr_IOStream)();
    }
    __gnu_cxx::
    __normal_iterator<Assimp::IOStream*const*,std::vector<Assimp::IOStream*,std::allocator<Assimp::IOStream*>>>
    ::__normal_iterator<Assimp::IOStream**>
              ((__normal_iterator<Assimp::IOStream*const*,std::vector<Assimp::IOStream*,std::allocator<Assimp::IOStream*>>>
                *)&local_40,&local_20);
    std::vector<Assimp::IOStream_*,_std::allocator<Assimp::IOStream_*>_>::erase
              (&this->created_streams,local_40);
  }
  else if (this->existing_io != (IOSystem *)0x0) {
    (*this->existing_io->_vptr_IOSystem[5])(this->existing_io,it._M_current);
  }
  return;
}

Assistant:

void Close( IOStream* pFile) override {
        auto it = std::find(created_streams.begin(), created_streams.end(), pFile);
        if (it != created_streams.end()) {
            delete pFile;
            created_streams.erase(it);
        } else if (existing_io) {
            existing_io->Close(pFile);
        }
    }